

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void __thiscall AActor::Revive(AActor *this)

{
  BYTE *pBVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  PClass *pPVar8;
  
  pPVar8 = (this->super_DThinker).super_DObject.Class;
  if (pPVar8 == (PClass *)0x0) {
    iVar7 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
    pPVar8 = (PClass *)CONCAT44(extraout_var,iVar7);
    (this->super_DThinker).super_DObject.Class = pPVar8;
  }
  pBVar1 = pPVar8->Defaults;
  uVar3 = *(uint *)(pBVar1 + 0x18c);
  uVar4 = *(uint *)(pBVar1 + 400);
  uVar5 = *(uint *)(pBVar1 + 0x194);
  uVar6 = *(uint *)(pBVar1 + 0x198);
  (this->flags).Value = uVar3;
  (this->flags2).Value = uVar4;
  (this->flags3).Value = uVar5;
  (this->flags4).Value = uVar6;
  uVar2 = *(undefined8 *)(pBVar1 + 0x19c);
  this->flags5 = (ActorFlags5)(int)uVar2;
  this->flags6 = (ActorFlags6)(int)((ulong)uVar2 >> 0x20);
  (this->flags7).Value = *(uint *)(pBVar1 + 0x1a4);
  if ((this->SpawnFlags & 0x2000) != 0) {
    (this->flags).Value = uVar3 | 0x8000000;
  }
  (this->DamageType).super_FName.Index = *(int *)(pBVar1 + 0x3c4);
  iVar7 = SpawnHealth(this);
  this->health = iVar7;
  this->target = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
  this->lastenemy = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
  if (((this->flags).Value & 0x8400000) == 0x400000) {
    level.total_monsters = level.total_monsters + 1;
  }
  return;
}

Assistant:

void AActor::Revive()
{
	AActor *info = GetDefault();
	flags = info->flags;
	flags2 = info->flags2;
	flags3 = info->flags3;
	flags4 = info->flags4;
	flags5 = info->flags5;
	flags6 = info->flags6;
	flags7 = info->flags7;
	if (SpawnFlags & MTF_FRIENDLY) flags |= MF_FRIENDLY;
	DamageType = info->DamageType;
	health = SpawnHealth();
	target = NULL;
	lastenemy = NULL;

	// [RH] If it's a monster, it gets to count as another kill
	if (CountsAsKill())
	{
		level.total_monsters++;
	}
}